

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::~IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&this->super_IfcStructuralConnection + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcStructuralConnection).field_0x0 + lVar3);
  plVar2 = (long *)(&(this->super_IfcStructuralConnection).field_0xb8 + lVar3);
  plVar2[-0x17] = 0x8e29a8;
  plVar2[0x11] = 0x8e2a20;
  plVar2[-6] = 0x8e29d0;
  plVar2[-4] = 0x8e29f8;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x8e2ac0;
  puVar1[0x28] = 0x8e2ae8;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0x158);
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}